

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::MSU(Sequencer *this,unsigned_short instruction)

{
  ushort uVar1;
  unsigned_short word;
  unsigned_short address;
  ostream *poVar2;
  ushort uVar3;
  ushort address_00;
  ushort uVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"MSU");
  poVar2 = std::operator<<(poVar2," ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  address_00 = instruction & 0x3ff;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,address_00);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar2);
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,address_00,0);
  address = Memory::Read((this->m_Memory).
                         super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,0);
  uVar1 = -(word & 0x3fff);
  if ((word >> 0xe & 1) == 0) {
    uVar1 = word & 0x3fff;
  }
  uVar3 = -(address & 0x3fff);
  if ((address >> 0xe & 1) != 0) {
    uVar3 = address & 0x3fff;
  }
  uVar4 = 0x7ffe;
  if (0 < (short)(uVar3 + uVar1)) {
    uVar4 = 0x3fff;
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address_00,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,uVar4 & uVar3 + uVar1);
  return;
}

Assistant:

void egc::Sequencer::MSU (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "MSU" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto a = m_Memory->Read(00000u);

    auto digitsMk = static_cast<short>(mk & 037777u);
    auto digitsA = static_cast<short>(a & 037777u);

    auto signMk = mk & 040000u;
    auto signA = a & 040000u;

    if (signMk)
    {
        digitsMk *= -1;
    }
    if (signA)
    {
        digitsA *= -1;
    }

    auto resultTwoComplement = digitsMk - digitsA;

    unsigned short result;

    if (resultTwoComplement > 0)
    {
        result = static_cast<unsigned short>(resultTwoComplement) & 037777u;
    }
    else
    {
        result = static_cast<unsigned short>(resultTwoComplement) & 077777u - 000001u;
    }

    m_Memory->Write(k, mk);
    m_Memory->Write(a, result);
}